

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O0

int __thiscall ncnn::Reduction::forward(Reduction *this,Mat *bottom_blob,Mat *top_blob)

{
  int iVar1;
  float *pfVar2;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar3;
  int i_1;
  int j;
  int i;
  float *outptr;
  int q_1;
  int q;
  int size;
  int channels;
  int h;
  int w;
  int ret;
  float in_stack_00000264;
  int in_stack_00000268;
  float in_stack_0000026c;
  undefined4 in_stack_00000270;
  float in_stack_00000274;
  int in_stack_00000278;
  float in_stack_0000027c;
  Mat *in_stack_00000280;
  Mat *in_stack_00000288;
  float in_stack_000002a4;
  int in_stack_000002a8;
  float in_stack_000002ac;
  Mat *in_stack_000002b0;
  Mat *in_stack_000002b8;
  Mat *this_00;
  Mat *in_stack_ffffffffffffff58;
  int local_90;
  int local_8c;
  int local_88;
  Mat local_78;
  Mat *local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Mat *local_20;
  long local_18;
  int local_4;
  
  if (*(int *)(in_RDI + 0x80) == 0) {
    local_4 = reduction_op<std::plus<float>,std::plus<float>>
                        (in_stack_000002b8,in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,
                         in_stack_000002a4);
  }
  else if (*(int *)(in_RDI + 0x80) == 1) {
    local_4 = reduction_op<ncnn::reduction_op_asum<float>,std::plus<float>>
                        (in_stack_00000288,in_stack_00000280,in_stack_0000027c,in_stack_00000278,
                         in_stack_00000274);
  }
  else if (*(int *)(in_RDI + 0x80) == 2) {
    local_4 = reduction_op<ncnn::reduction_op_sumsq<float>,std::plus<float>>
                        (in_stack_00000288,in_stack_00000280,in_stack_0000027c,in_stack_00000278,
                         in_stack_00000274);
  }
  else {
    if (*(int *)(in_RDI + 0x80) == 3) {
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_24 = reduction_op<std::plus<float>,std::plus<float>>
                           (in_stack_000002b8,in_stack_000002b0,in_stack_000002ac,in_stack_000002a8,
                            in_stack_000002a4);
      if (local_24 != 0) {
        return -100;
      }
      local_28 = *(int *)(local_18 + 0x1c);
      local_2c = *(int *)(local_18 + 0x20);
      local_30 = *(int *)(local_18 + 0x24);
      local_34 = local_28 * local_2c;
      if (*(int *)(in_RDI + 0x84) == 0) {
        iVar1 = local_30 * local_34;
        pfVar2 = Mat::operator[](local_20,0);
        *pfVar2 = *pfVar2 / (float)iVar1;
      }
      else if (*(int *)(in_RDI + 0x84) == 1) {
        for (local_38 = 0; local_38 < local_30; local_38 = local_38 + 1) {
          fVar3 = (float)local_34;
          pfVar2 = Mat::operator[](local_20,local_38);
          *pfVar2 = *pfVar2 / fVar3;
        }
      }
      else if (*(int *)(in_RDI + 0x84) == 2) {
        for (local_3c = 0; local_3c < local_30; local_3c = local_3c + 1) {
          this_00 = &local_78;
          Mat::channel(in_stack_ffffffffffffff58,(int)((ulong)this_00 >> 0x20));
          in_stack_ffffffffffffff58 = (Mat *)Mat::operator_cast_to_float_(this_00);
          Mat::~Mat((Mat *)0x1238a4);
          for (local_88 = 0; local_88 < local_2c; local_88 = local_88 + 1) {
            *(float *)((long)&in_stack_ffffffffffffff58->data + (long)local_88 * 4) =
                 *(float *)((long)&in_stack_ffffffffffffff58->data + (long)local_88 * 4) /
                 (float)local_28;
          }
          local_48 = in_stack_ffffffffffffff58;
        }
      }
      else if (*(int *)(in_RDI + 0x84) == -1) {
        for (local_8c = 0; local_8c < local_28; local_8c = local_8c + 1) {
          iVar1 = local_2c * local_30;
          pfVar2 = Mat::operator[](local_20,local_8c);
          *pfVar2 = *pfVar2 / (float)iVar1;
        }
      }
      else if (*(int *)(in_RDI + 0x84) == -2) {
        for (local_90 = 0; local_90 < local_34; local_90 = local_90 + 1) {
          fVar3 = (float)local_30;
          pfVar2 = Mat::operator[](local_20,local_90);
          *pfVar2 = *pfVar2 / fVar3;
        }
      }
    }
    if (*(int *)(in_RDI + 0x80) == 4) {
      local_4 = reduction_op<ncnn::reduction_op_max<float>,ncnn::reduction_op_max<float>>
                          ((Mat *)CONCAT44(in_stack_0000027c,in_stack_00000278),
                           (Mat *)CONCAT44(in_stack_00000274,in_stack_00000270),in_stack_0000026c,
                           in_stack_00000268,in_stack_00000264);
    }
    else if (*(int *)(in_RDI + 0x80) == 5) {
      local_4 = reduction_op<ncnn::reduction_op_min<float>,ncnn::reduction_op_min<float>>
                          ((Mat *)CONCAT44(in_stack_0000027c,in_stack_00000278),
                           (Mat *)CONCAT44(in_stack_00000274,in_stack_00000270),in_stack_0000026c,
                           in_stack_00000268,in_stack_00000264);
    }
    else if (*(int *)(in_RDI + 0x80) == 6) {
      local_4 = reduction_op<std::multiplies<float>,std::multiplies<float>>
                          ((Mat *)CONCAT44(in_stack_0000027c,in_stack_00000278),
                           (Mat *)CONCAT44(in_stack_00000274,in_stack_00000270),in_stack_0000026c,
                           in_stack_00000268,in_stack_00000264);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int Reduction::forward(const Mat& bottom_blob, Mat& top_blob) const
{
    if (operation == ReductionOp_SUM)
        return reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_ASUM)
        return reduction_op< reduction_op_asum<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_SUMSQ)
        return reduction_op< reduction_op_sumsq<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);

    if (operation == ReductionOp_MEAN)
    {
        int ret = reduction_op< std::plus<float>, std::plus<float> >(bottom_blob, top_blob, 0.f, dim, coeff);
        if (ret != 0)
            return -100;

        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        if (dim == 0)
        {
            top_blob[0] /= channels * size;
        }
        else if (dim == 1)
        {
            for (int q=0; q<channels; q++)
            {
                top_blob[q] /= size;
            }
        }
        else if (dim == 2)
        {
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<h; i++)
                {
                    outptr[i] /= w;
                }
            }
        }
        else if (dim == -1)
        {
            for (int j=0; j<w; j++)
            {
                top_blob[j] /= h * channels;
            }
        }
        else if (dim == -2)
        {
            for (int i=0; i<size; i++)
            {
                top_blob[i] /= channels;
            }
        }
    }

    if (operation == ReductionOp_MAX)
        return reduction_op< reduction_op_max<float>, reduction_op_max<float> >(bottom_blob, top_blob, -FLT_MAX, dim, coeff);

    if (operation == ReductionOp_MIN)
        return reduction_op< reduction_op_min<float>, reduction_op_min<float> >(bottom_blob, top_blob, FLT_MAX, dim, coeff);

    if (operation == ReductionOp_PROD)
        return reduction_op< std::multiplies<float>, std::multiplies<float> >(bottom_blob, top_blob, 1.f, dim, coeff);

    return 0;
}